

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O3

opj_tgt_tree_t * tgt_init(opj_tgt_tree_t *p_tree,OPJ_UINT32 p_num_leafs_h,OPJ_UINT32 p_num_leafs_v)

{
  opj_tgt_node *poVar1;
  OPJ_UINT32 OVar2;
  opj_tgt_node_t *__ptr;
  OPJ_UINT32 OVar3;
  ulong uVar4;
  OPJ_UINT32 *pOVar5;
  opj_tgt_node *poVar6;
  uint uVar7;
  opj_tgt_node *poVar8;
  OPJ_UINT32 OVar9;
  uint uVar10;
  uint uVar11;
  OPJ_INT32 l_nplv [32];
  OPJ_INT32 l_nplh [32];
  OPJ_UINT32 local_138 [32];
  OPJ_UINT32 local_b8 [34];
  
  if (p_tree == (opj_tgt_tree_t *)0x0) {
LAB_00135637:
    p_tree = (opj_tgt_tree_t *)0x0;
  }
  else {
    if ((p_tree->numleafsh != p_num_leafs_h) || (p_tree->numleafsv != p_num_leafs_v)) {
      p_tree->numleafsh = p_num_leafs_h;
      p_tree->numleafsv = p_num_leafs_v;
      local_b8[0] = p_num_leafs_h;
      local_138[0] = p_num_leafs_v;
      OVar2 = 0;
      uVar11 = 0xffffffff;
      OVar9 = p_num_leafs_h;
      OVar3 = p_num_leafs_v;
      do {
        uVar10 = OVar3 * OVar9;
        OVar9 = (int)((OVar9 - ((int)(OVar9 + 1) >> 0x1f)) + 1) >> 1;
        local_b8[uVar11 + 2] = OVar9;
        OVar3 = (int)((OVar3 - ((int)(OVar3 + 1) >> 0x1f)) + 1) >> 1;
        local_138[uVar11 + 2] = OVar3;
        OVar2 = OVar2 + uVar10;
        uVar11 = uVar11 + 1;
      } while (1 < uVar10);
      p_tree->numnodes = OVar2;
      if (OVar2 == 0) {
LAB_0013562f:
        tgt_destroy(p_tree);
        goto LAB_00135637;
      }
      uVar10 = OVar2 * 0x18;
      __ptr = p_tree->nodes;
      if (p_tree->nodes_size < uVar10) {
        __ptr = (opj_tgt_node_t *)realloc(__ptr,(ulong)uVar10);
        p_tree->nodes = __ptr;
        if (__ptr == (opj_tgt_node_t *)0x0) goto LAB_0013562f;
        memset((void *)((long)&__ptr->parent + (ulong)p_tree->nodes_size),0,
               (ulong)(uVar10 - p_tree->nodes_size));
        p_tree->nodes_size = uVar10;
        p_num_leafs_h = p_tree->numleafsh;
        p_num_leafs_v = p_tree->numleafsv;
      }
      if (uVar11 != 0) {
        poVar6 = __ptr + p_num_leafs_v * p_num_leafs_h;
        uVar4 = 0;
        poVar8 = poVar6;
        do {
          OVar9 = local_138[uVar4];
          if (0 < (int)OVar9) {
            OVar3 = local_b8[uVar4];
            uVar10 = 0;
            do {
              uVar7 = OVar3 + 2;
              if (0 < (int)OVar3) {
                do {
                  __ptr->parent = poVar8;
                  if (uVar7 == 3) {
                    poVar8 = poVar8 + 1;
                    __ptr = __ptr + 1;
                    break;
                  }
                  __ptr[1].parent = poVar8;
                  __ptr = __ptr + 2;
                  poVar8 = poVar8 + 1;
                  uVar7 = uVar7 - 2;
                } while (2 < uVar7);
              }
              poVar1 = poVar6 + (int)OVar3;
              if (uVar10 == OVar9 - 1 || (uVar10 & 1) != 0) {
                poVar1 = poVar8;
                poVar6 = poVar8;
              }
              poVar8 = poVar6;
              poVar6 = poVar1;
              uVar10 = uVar10 + 1;
            } while (uVar10 != OVar9);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar11);
      }
      __ptr->parent = (opj_tgt_node *)0x0;
    }
    OVar9 = p_tree->numnodes;
    if (OVar9 != 0) {
      pOVar5 = &p_tree->nodes->known;
      do {
        *(undefined8 *)(pOVar5 + -2) = 999;
        *pOVar5 = 0;
        pOVar5 = pOVar5 + 6;
        OVar9 = OVar9 - 1;
      } while (OVar9 != 0);
    }
  }
  return p_tree;
}

Assistant:

opj_tgt_tree_t *tgt_init(opj_tgt_tree_t * p_tree,OPJ_UINT32 p_num_leafs_h, OPJ_UINT32 p_num_leafs_v)
{
	OPJ_INT32 l_nplh[32];
	OPJ_INT32 l_nplv[32];
	opj_tgt_node_t *l_node = 00;
	opj_tgt_node_t *l_parent_node = 00;
	opj_tgt_node_t *l_parent_node0 = 00;
	OPJ_UINT32 i;
	OPJ_INT32 j,k;
	OPJ_UINT32 l_num_levels;
	OPJ_UINT32 n;
	OPJ_UINT32 l_node_size;

	if
		(! p_tree)
	{
		return 00;
	}
	if
		((p_tree->numleafsh != p_num_leafs_h) || (p_tree->numleafsv != p_num_leafs_v))
	{
		p_tree->numleafsh = p_num_leafs_h;
		p_tree->numleafsv = p_num_leafs_v;

		l_num_levels = 0;
		l_nplh[0] = p_num_leafs_h;
		l_nplv[0] = p_num_leafs_v;
		p_tree->numnodes = 0;
		do
		{
			n = l_nplh[l_num_levels] * l_nplv[l_num_levels];
			l_nplh[l_num_levels + 1] = (l_nplh[l_num_levels] + 1) / 2;
			l_nplv[l_num_levels + 1] = (l_nplv[l_num_levels] + 1) / 2;
			p_tree->numnodes += n;
			++l_num_levels;
		}
		while (n > 1);

		/* ADD */
		if
			(p_tree->numnodes == 0)
		{
			tgt_destroy(p_tree);
            return 00;
		}
		l_node_size = p_tree->numnodes * sizeof(opj_tgt_node_t);
		if
			(l_node_size > p_tree->nodes_size)
		{
			p_tree->nodes = (opj_tgt_node_t*) opj_realloc(p_tree->nodes, l_node_size);
			if
				(! p_tree->nodes)
			{
				tgt_destroy(p_tree);
				return 00;
			}
			memset(((char *) p_tree->nodes) + p_tree->nodes_size, 0 , l_node_size - p_tree->nodes_size);
			p_tree->nodes_size = l_node_size;
		}
		l_node = p_tree->nodes;
		l_parent_node = &p_tree->nodes[p_tree->numleafsh * p_tree->numleafsv];
		l_parent_node0 = l_parent_node;

		for
			(i = 0; i < l_num_levels - 1; ++i)
		{
			for
				(j = 0; j < l_nplv[i]; ++j)
			{
				k = l_nplh[i];
				while
					(--k >= 0)
				{
					l_node->parent = l_parent_node;
					++l_node;
					if (--k >= 0)
					{
						l_node->parent = l_parent_node;
						++l_node;
					}
					++l_parent_node;
				}
				if ((j & 1) || j == l_nplv[i] - 1)
				{
					l_parent_node0 = l_parent_node;
				}
				else
				{
					l_parent_node = l_parent_node0;
					l_parent_node0 += l_nplh[i];
				}
			}
		}
		l_node->parent = 0;
	}
	tgt_reset(p_tree);

	return p_tree;
}